

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configfile.cpp
# Opt level: O0

bool __thiscall FConfigFile::SetSection(FConfigFile *this,char *name,bool allowCreate)

{
  FConfigSection *local_30;
  FConfigSection *section;
  bool allowCreate_local;
  char *name_local;
  FConfigFile *this_local;
  
  local_30 = FindSection(this,name);
  if ((local_30 == (FConfigSection *)0x0) && (allowCreate)) {
    local_30 = NewConfigSection(this,name);
  }
  if (local_30 != (FConfigSection *)0x0) {
    this->CurrentSection = local_30;
    this->CurrentEntry = local_30->RootEntry;
  }
  return local_30 != (FConfigSection *)0x0;
}

Assistant:

bool FConfigFile::SetSection (const char *name, bool allowCreate)
{
	FConfigSection *section = FindSection (name);
	if (section == NULL && allowCreate)
	{
		section = NewConfigSection (name);
	}
	if (section != NULL)
	{
		CurrentSection = section;
		CurrentEntry = section->RootEntry;
		return true;
	}
	return false;
}